

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_flashfader.cpp
# Opt level: O0

void __thiscall DFlashFader::Serialize(DFlashFader *this,FArchive *arc)

{
  FArchive *pFVar1;
  int local_20;
  int local_1c;
  int j;
  int i;
  FArchive *arc_local;
  DFlashFader *this_local;
  
  DObject::Serialize((DObject *)this,arc);
  pFVar1 = FArchive::operator<<(arc,&this->TotalTics);
  pFVar1 = FArchive::operator<<(pFVar1,&this->StartTic);
  ::operator<<(pFVar1,&this->ForWho);
  for (local_1c = 1; -1 < local_1c; local_1c = local_1c + -1) {
    for (local_20 = 3; -1 < local_20; local_20 = local_20 + -1) {
      FArchive::operator<<(arc,this->Blends[local_1c] + local_20);
    }
  }
  return;
}

Assistant:

void DFlashFader::Serialize (FArchive &arc)
{
	Super::Serialize (arc);
	arc << TotalTics << StartTic << ForWho;
	for (int i = 1; i >= 0; --i)
		for (int j = 3; j >= 0; --j)
			arc << Blends[i][j];
}